

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O0

void ihevc_intra_pred_ref_filtering
               (UWORD8 *pu1_src,WORD32 nt,UWORD8 *pu1_dst,WORD32 mode,
               WORD32 strong_intra_smoothing_enable_flag)

{
  byte bVar1;
  UWORD32 UVar2;
  int in_ECX;
  byte *in_RDX;
  UWORD32 in_ESI;
  byte *in_RDI;
  int in_R8D;
  WORD32 dc_val;
  WORD32 abs_cond_top_flag;
  WORD32 abs_cond_left_flag;
  WORD32 bi_linear_int_flag;
  UWORD8 au1_flt [257];
  WORD32 four_nt;
  WORD32 i;
  WORD32 filter_flag;
  bool local_155;
  int local_154;
  int local_150;
  byte local_138 [268];
  int local_2c;
  int local_28;
  uint local_24;
  int local_20;
  byte *local_18;
  UWORD32 local_c;
  byte *local_8;
  
  local_2c = in_ESI << 2;
  local_155 = false;
  bVar1 = "\x0e"[in_ECX];
  local_20 = in_R8D;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  UVar2 = CTZ(in_ESI);
  local_24 = (uint)bVar1 & 1 << ((char)UVar2 - 2U & 0x1f);
  if (local_24 == 0) {
    if (local_8 != local_18) {
      for (local_28 = 0; local_28 < local_2c + 1; local_28 = local_28 + 1) {
        local_18[local_28] = local_8[local_28];
      }
    }
  }
  else {
    if ((local_20 == 1) && (local_c == 0x20)) {
      if ((int)((uint)local_8[0x40] + (uint)local_8[0x80] + (uint)local_8[0x60] * -2) < 1) {
        local_150 = -((uint)local_8[0x40] + (uint)local_8[0x80] + (uint)local_8[0x60] * -2);
      }
      else {
        local_150 = (uint)local_8[0x40] + (uint)local_8[0x80] + (uint)local_8[0x60] * -2;
      }
      if ((int)((uint)local_8[0x40] + (uint)*local_8 + (uint)local_8[0x20] * -2) < 1) {
        local_154 = -((uint)local_8[0x40] + (uint)*local_8 + (uint)local_8[0x20] * -2);
      }
      else {
        local_154 = (uint)local_8[0x40] + (uint)*local_8 + (uint)local_8[0x20] * -2;
      }
      local_155 = local_154 < 8 && local_150 < 8;
    }
    local_138[0] = *local_8;
    local_138[(int)(local_c << 2)] = local_8[(int)(local_c << 2)];
    if (local_155) {
      local_138[(int)(local_c << 1)] = local_8[(int)(local_c << 1)];
      for (local_28 = 1; SBORROW4(local_28,local_c * 2) != (int)(local_28 + local_c * -2) < 0;
          local_28 = local_28 + 1) {
        local_138[local_28] =
             (byte)((int)((local_c * 2 - local_28) * (uint)*local_8 +
                          local_28 * (uint)local_8[(int)(local_c << 1)] + 0x20) >> 6);
      }
      for (local_28 = 1; SBORROW4(local_28,local_c * 2) != (int)(local_28 + local_c * -2) < 0;
          local_28 = local_28 + 1) {
        local_138[(int)(local_28 + local_c * 2)] =
             (byte)((int)((local_c * 2 - local_28) * (uint)local_8[(int)(local_c << 1)] +
                          local_28 * (uint)local_8[(int)(local_c << 2)] + 0x20) >> 6);
      }
    }
    else {
      for (local_28 = 0; local_28 < local_2c + -1; local_28 = local_28 + 1) {
        local_138[local_28 + 1] =
             (byte)((int)((uint)local_8[local_28] + (uint)local_8[local_28 + 1] * 2 +
                          (uint)local_8[local_28 + 2] + 2) >> 2);
      }
    }
    for (local_28 = 0; local_28 < local_2c + 1; local_28 = local_28 + 1) {
      local_18[local_28] = local_138[local_28];
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_ref_filtering(UWORD8 *pu1_src,
                                    WORD32 nt,
                                    UWORD8 *pu1_dst,
                                    WORD32 mode,
                                    WORD32 strong_intra_smoothing_enable_flag)
{
    WORD32 filter_flag;
    WORD32 i; /* Generic indexing variable */
    WORD32 four_nt = 4 * nt;
    UWORD8 au1_flt[(4 * MAX_CU_SIZE) + 1];
    WORD32 bi_linear_int_flag = 0;
    WORD32 abs_cond_left_flag = 0;
    WORD32 abs_cond_top_flag = 0;
    /*WORD32 dc_val = 1 << (BIT_DEPTH - 5);*/
    WORD32 dc_val = 1 << (8 - 5);
    //WORD32 strong_intra_smoothing_enable_flag  = 1;

    filter_flag = gau1_intra_pred_ref_filter[mode] & (1 << (CTZ(nt) - 2));
    if(0 == filter_flag)
    {
        if(pu1_src == pu1_dst)
        {
            return;
        }
        else
        {
            for(i = 0; i < (four_nt + 1); i++)
                pu1_dst[i] = pu1_src[i];
        }
    }

    else
    {
        /* If strong intra smoothin is enabled and transform size is 32 */
        if((1 == strong_intra_smoothing_enable_flag) && (32 == nt))
        {
            /* Strong Intra Filtering */
            abs_cond_top_flag = (ABS(pu1_src[2 * nt] + pu1_src[4 * nt]
                            - (2 * pu1_src[3 * nt]))) < dc_val;
            abs_cond_left_flag = (ABS(pu1_src[2 * nt] + pu1_src[0]
                            - (2 * pu1_src[nt]))) < dc_val;

            bi_linear_int_flag = ((1 == abs_cond_left_flag)
                            && (1 == abs_cond_top_flag));
        }
        /* Extremities Untouched*/
        au1_flt[0] = pu1_src[0];
        au1_flt[4 * nt] = pu1_src[4 * nt];

        /* Strong filtering of reference samples */
        if(1 == bi_linear_int_flag)
        {
            au1_flt[2 * nt] = pu1_src[2 * nt];

            for(i = 1; i < (2 * nt); i++)
                au1_flt[i] = (((2 * nt) - i) * pu1_src[0] + i * pu1_src[2 * nt] + 32) >> 6;

            for(i = 1; i < (2 * nt); i++)
                au1_flt[i + (2 * nt)] = (((2 * nt) - i) * pu1_src[2 * nt] + i * pu1_src[4 * nt] + 32) >> 6;

        }
        else
        {
            /* Perform bilinear filtering of Reference Samples */
            for(i = 0; i < (four_nt - 1); i++)
            {
                au1_flt[i + 1] = (pu1_src[i] + 2 * pu1_src[i + 1]
                                + pu1_src[i + 2] + 2) >> 2;
            }
        }


        for(i = 0; i < (four_nt + 1); i++)
            pu1_dst[i] = au1_flt[i];
    }

}